

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakefileDepsParser.cpp
# Opt level: O0

void __thiscall llbuild::core::MakefileDepsParser::parse(MakefileDepsParser *this)

{
  ParseActions *pPVar1;
  size_t sVar2;
  bool bVar3;
  StringRef SVar4;
  char *local_238;
  size_t local_230;
  char *local_228;
  long local_220;
  char *local_218 [2];
  char *local_208;
  char *wordStart_1;
  StringRef local_1f0;
  char *local_1e0;
  long local_1d8;
  char *local_1d0 [2];
  char *local_1c0;
  char *wordStart;
  SmallString<256U> unescapedWord;
  char *end;
  char *cur;
  MakefileDepsParser *this_local;
  MakefileDepsParser *local_88;
  MakefileDepsParser *local_80;
  MakefileDepsParser *local_78;
  MakefileDepsParser *local_70;
  char *local_68;
  char **local_60;
  char *local_58;
  char **local_50;
  char *local_48;
  char **local_40;
  long local_38;
  char *local_30;
  char **local_28;
  long local_20;
  char *local_18;
  char **local_10;
  
  end = (this->data).Data;
  unescapedWord.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
  _248_8_ = end + (this->data).Length;
  cur = (char *)this;
  local_78 = this;
  local_70 = this;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)&wordStart);
  do {
    while( true ) {
      while( true ) {
        if ((end == (char *)unescapedWord.super_SmallVector<char,_256U>.
                            super_SmallVectorStorage<char,_256U>.InlineElts._248_8_) ||
           (skipWhitespaceAndComments
                      (&end,(char *)unescapedWord.super_SmallVector<char,_256U>.
                                    super_SmallVectorStorage<char,_256U>.InlineElts._248_8_),
           end == (char *)unescapedWord.super_SmallVector<char,_256U>.
                          super_SmallVectorStorage<char,_256U>.InlineElts._248_8_))
        goto LAB_002fc441;
        local_1c0 = end;
        llvm::SmallVectorImpl<char>::clear((SmallVectorImpl<char> *)&wordStart);
        lexWord(&end,(char *)unescapedWord.super_SmallVector<char,_256U>.
                             super_SmallVectorStorage<char,_256U>.InlineElts._248_8_,
                (SmallVectorImpl<char> *)&wordStart);
        if (end != local_1c0) break;
        pPVar1 = this->actions;
        local_60 = local_1d0;
        local_68 = "unexpected character in file";
        local_1d0[0] = "unexpected character in file";
        sVar2 = strlen("unexpected character in file");
        local_80 = this;
        (*pPVar1->_vptr_ParseActions[2])
                  (pPVar1,local_1d0[0],sVar2,(long)end - (long)(this->data).Data);
        skipToEndOfLine(&end,(char *)unescapedWord.super_SmallVector<char,_256U>.
                                     super_SmallVectorStorage<char,_256U>.InlineElts._248_8_);
      }
      pPVar1 = this->actions;
      local_1d8 = (long)end - (long)local_1c0;
      local_28 = &local_1e0;
      local_30 = local_1c0;
      local_1e0 = local_1c0;
      local_38 = local_1d8;
      local_1f0 = llvm::SmallString<256U>::str((SmallString<256U> *)&wordStart);
      (*pPVar1->_vptr_ParseActions[3])(pPVar1,local_1e0,local_1d8,local_1f0.Data,local_1f0.Length);
      skipNonNewlineWhitespace
                (&end,(char *)unescapedWord.super_SmallVector<char,_256U>.
                              super_SmallVectorStorage<char,_256U>.InlineElts._248_8_);
      if ((end != (char *)unescapedWord.super_SmallVector<char,_256U>.
                          super_SmallVectorStorage<char,_256U>.InlineElts._248_8_) && (*end == ':'))
      break;
      pPVar1 = this->actions;
      local_50 = &wordStart_1;
      local_58 = "missing \':\' following rule";
      wordStart_1 = "missing \':\' following rule";
      sVar2 = strlen("missing \':\' following rule");
      local_88 = this;
      (*pPVar1->_vptr_ParseActions[2])(pPVar1,wordStart_1,sVar2,(long)end - (long)(this->data).Data)
      ;
      (*this->actions->_vptr_ParseActions[5])();
      skipToEndOfLine(&end,(char *)unescapedWord.super_SmallVector<char,_256U>.
                                   super_SmallVectorStorage<char,_256U>.InlineElts._248_8_);
    }
    end = end + 1;
    while (((end != (char *)unescapedWord.super_SmallVector<char,_256U>.
                            super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ &&
            (skipNonNewlineWhitespace
                       (&end,(char *)unescapedWord.super_SmallVector<char,_256U>.
                                     super_SmallVectorStorage<char,_256U>.InlineElts._248_8_),
            end != (char *)unescapedWord.super_SmallVector<char,_256U>.
                           super_SmallVectorStorage<char,_256U>.InlineElts._248_8_)) &&
           (*end != '\n'))) {
      local_208 = end;
      llvm::SmallVectorImpl<char>::clear((SmallVectorImpl<char> *)&wordStart);
      lexWord(&end,(char *)unescapedWord.super_SmallVector<char,_256U>.
                           super_SmallVectorStorage<char,_256U>.InlineElts._248_8_,
              (SmallVectorImpl<char> *)&wordStart);
      if (end == local_208) {
        pPVar1 = this->actions;
        local_40 = local_218;
        local_48 = "unexpected character in prerequisites";
        local_218[0] = "unexpected character in prerequisites";
        sVar2 = strlen("unexpected character in prerequisites");
        this_local = this;
        (*pPVar1->_vptr_ParseActions[2])
                  (pPVar1,local_218[0],sVar2,(long)end - (long)(this->data).Data);
        skipToEndOfLine(&end,(char *)unescapedWord.super_SmallVector<char,_256U>.
                                     super_SmallVectorStorage<char,_256U>.InlineElts._248_8_);
      }
      else {
        while( true ) {
          bVar3 = false;
          if (end != (char *)unescapedWord.super_SmallVector<char,_256U>.
                             super_SmallVectorStorage<char,_256U>.InlineElts._248_8_) {
            bVar3 = *end == ':';
          }
          if (!bVar3) break;
          llvm::SmallVectorTemplateBase<char,_true>::push_back
                    ((SmallVectorTemplateBase<char,_true> *)&wordStart,end);
          end = end + 1;
          lexWord(&end,(char *)unescapedWord.super_SmallVector<char,_256U>.
                               super_SmallVectorStorage<char,_256U>.InlineElts._248_8_,
                  (SmallVectorImpl<char> *)&wordStart);
        }
        pPVar1 = this->actions;
        local_220 = (long)end - (long)local_208;
        local_10 = &local_228;
        local_18 = local_208;
        local_228 = local_208;
        local_20 = local_220;
        SVar4 = llvm::SmallString<256U>::str((SmallString<256U> *)&wordStart);
        local_238 = SVar4.Data;
        local_230 = SVar4.Length;
        (*pPVar1->_vptr_ParseActions[4])(pPVar1,local_228,local_220,local_238,local_230);
      }
    }
    (*this->actions->_vptr_ParseActions[5])();
  } while ((this->ignoreSubsequentOutputs & 1U) == 0);
LAB_002fc441:
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)&wordStart);
  return;
}

Assistant:

void MakefileDepsParser::parse() {
  const char* cur = data.data();
  const char* end = cur + data.size();
  // Storage for currently begin lexed unescaped word.
  SmallString<256> unescapedWord;

  // While we have input data...
  while (cur != end) {
    // Skip leading whitespace and comments.
    skipWhitespaceAndComments(cur, end);

    // If we have reached the end of the input, we are done.
    if (cur == end)
      break;
    
    // The next token should be a word.
    const char* wordStart = cur;
    unescapedWord.clear();
    lexWord(cur, end, unescapedWord);
    if (cur == wordStart) {
      actions.error("unexpected character in file", cur - data.data());
      skipToEndOfLine(cur, end);
      continue;
    }
    actions.actOnRuleStart(StringRef(wordStart, cur - wordStart),
                           unescapedWord.str());

    // The next token should be a colon.
    skipNonNewlineWhitespace(cur, end);
    if (cur == end || *cur != ':') {
      actions.error("missing ':' following rule", cur - data.data());
      actions.actOnRuleEnd();
      skipToEndOfLine(cur, end);
      continue;
    }

    // Skip the colon.
    ++cur;

    // Consume dependency words until we reach the end of a line.
    while (cur != end) {
      // Skip forward and check for EOL.
      skipNonNewlineWhitespace(cur, end);
      if (cur == end || *cur == '\n')
        break;

      // Otherwise, we should have a word.
      const char* wordStart = cur;
      unescapedWord.clear();
      lexWord(cur, end, unescapedWord);
      if (cur == wordStart) {
        actions.error("unexpected character in prerequisites",
                      cur - data.data());
        skipToEndOfLine(cur, end);
        continue;
      }
      // Given that GCC/Clang generally do not escape any special characters in
      // paths, we may encounter paths that contain them. Our lexer
      // automatically stops on some such characters, namely ':'. If the we find
      // a ':' at this point, we push it onto the word and continue lexing.
      while (cur != end && *cur == ':') {
        unescapedWord.push_back(*cur);
        ++cur;
        lexWord(cur, end, unescapedWord);
      }
      actions.actOnRuleDependency(StringRef(wordStart, cur - wordStart),
                                  unescapedWord.str());
    }
    actions.actOnRuleEnd();

    // Stop parsing if we only care about the first output's dependencies.
    if (ignoreSubsequentOutputs) break;
  }
}